

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void * __thiscall
pugi::impl::anon_unknown_0::xml_allocator::allocate_memory
          (xml_allocator *this,size_t size,xml_memory_page **out_page)

{
  ulong uVar1;
  size_t sVar2;
  xml_memory_page *pxVar3;
  xml_memory_page *pxVar4;
  xml_memory_page *pxVar5;
  size_t *psVar6;
  long lVar7;
  
  sVar2 = this->_busy_size;
  uVar1 = sVar2 + size;
  if (uVar1 < 0x7fd9) {
    pxVar5 = this->_root;
    this->_busy_size = uVar1;
    *out_page = pxVar5;
    return (void *)((long)&pxVar5[1].allocator + sVar2);
  }
  lVar7 = 0x8000;
  if (0x1ff6 < size) {
    lVar7 = size + 0x28;
  }
  pxVar5 = (xml_memory_page *)
           (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::allocate)
                     (lVar7);
  if (pxVar5 == (xml_memory_page *)0x0) {
    *out_page = (xml_memory_page *)0x0;
    pxVar5 = (xml_memory_page *)0x0;
  }
  else {
    pxVar5->busy_size = 0;
    pxVar5->freed_size = 0;
    pxVar5->prev = (xml_memory_page *)0x0;
    pxVar5->next = (xml_memory_page *)0x0;
    pxVar5->allocator = this;
    *out_page = pxVar5;
    if (size < 0x1ff7) {
      psVar6 = &this->_busy_size;
      pxVar3 = this->_root;
      pxVar3->busy_size = this->_busy_size;
      pxVar5->prev = pxVar3;
      pxVar3->next = pxVar5;
      this->_root = pxVar5;
    }
    else {
      pxVar3 = this->_root;
      pxVar4 = pxVar3->prev;
      pxVar5->prev = pxVar4;
      pxVar5->next = pxVar3;
      pxVar4->next = pxVar5;
      pxVar3->prev = pxVar5;
      psVar6 = &pxVar5->busy_size;
    }
    *psVar6 = size;
    pxVar5 = pxVar5 + 1;
  }
  return pxVar5;
}

Assistant:

void* allocate_memory(size_t size, xml_memory_page*& out_page)
		{
			if (PUGI_IMPL_UNLIKELY(_busy_size + size > xml_memory_page_size))
				return allocate_memory_oob(size, out_page);

			void* buf = reinterpret_cast<char*>(_root) + sizeof(xml_memory_page) + _busy_size;

			_busy_size += size;

			out_page = _root;

			return buf;
		}